

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  ostream *poVar4;
  int passed;
  exception *e;
  localization_backend_manager mgr;
  localization_backend_manager local_50 [15];
  allocator local_41;
  string local_40 [48];
  string local_10 [12];
  undefined4 local_4;
  
  local_4 = 0;
  booster::locale::localization_backend_manager::global();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"posix",&local_41);
  booster::locale::localization_backend_manager::select(local_10,(uint)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  booster::locale::localization_backend_manager::global(local_50);
  booster::locale::localization_backend_manager::~localization_backend_manager(local_50);
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing char");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_char<char>();
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing wchar_t");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_char<wchar_t>();
  booster::locale::localization_backend_manager::~localization_backend_manager
            ((localization_backend_manager *)local_10);
  iVar1 = test_counter - error_counter;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4," tests");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (0 < error_counter) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,error_counter);
    poVar4 = std::operator<<(poVar4," tests");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
  _Var2 = std::setprecision(1);
  poVar4 = std::operator<<(poVar4,_Var2);
  _Var3 = std::setw(5);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,((double)iVar1 * 100.0) / (double)test_counter);
  poVar4 = std::operator<<(poVar4,"% of tests completed sucsessefully");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return (uint)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        booster::locale::localization_backend_manager mgr = booster::locale::localization_backend_manager::global();
        mgr.select("posix");
        booster::locale::localization_backend_manager::global(mgr);

        std::cout << "Testing char" << std::endl;
        test_char<char>();
        std::cout << "Testing wchar_t" << std::endl;
        test_char<wchar_t>();
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();

}